

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-view.h
# Opt level: O0

int __thiscall IntView<0>::getType(IntView<0> *this)

{
  bool bVar1;
  int t;
  IntView<0> *this_local;
  
  bVar1 = this->a < 0;
  if (bVar1) {
    this->a = -this->a;
  }
  t = (int)bVar1;
  if (1 < this->a) {
    t = t | 2;
  }
  if (this->b != 0) {
    t = t | 4;
  }
  return t;
}

Assistant:

int getType() {
		int t = 0;
		if (a < 0) {
			a = -a;
			t |= 1;
		}
		if (a > 1) {
			t |= 2;
		}
		if (b != 0) {
			t |= 4;
		}
		return t;
	}